

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O2

void event_signal_missile(game_event_type type,object *obj,_Bool seen,wchar_t y,wchar_t x)

{
  game_event_data data;
  game_event_data local_30;
  
  local_30.missile.obj = obj;
  local_30.missile.seen = seen;
  local_30.bolt.ox = y;
  local_30.birthstage.n_choices = x;
  game_event_dispatch(type,&local_30);
  return;
}

Assistant:

void event_signal_missile(game_event_type type,
						  struct object *obj,
						  bool seen,
						  int y,
						  int x)
{
	game_event_data data;
	data.missile.obj = obj;
	data.missile.seen = seen;
	data.missile.y = y;
	data.missile.x = x;

	game_event_dispatch(type, &data);
}